

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmNinjaTargetGenerator::WriteTargetDependInfo(cmNinjaTargetGenerator *this,string *lang)

{
  cmMakefile *this_00;
  cmGeneratorTarget *pcVar1;
  cmLocalNinjaGenerator *this_01;
  size_t lang_00;
  bool bVar2;
  Value *pVVar3;
  char *pcVar4;
  ulong uVar5;
  string *config;
  reference pbVar6;
  undefined1 local_578 [8];
  cmGeneratedFileStream tdif;
  string tdin;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2e8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2e0;
  iterator i_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  linked;
  Value *tdi_linked_target_dirs;
  Value local_270;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_248;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_240;
  iterator i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  Value *tdi_include_dirs;
  Value local_1c8;
  Value local_1a0;
  Value local_178;
  Value local_150;
  allocator local_121;
  string local_120;
  undefined1 local_100 [8];
  string mod_dir;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  Value local_a0;
  Value local_68;
  undefined1 local_40 [8];
  Value tdi;
  string *lang_local;
  cmNinjaTargetGenerator *this_local;
  
  tdi.limit_ = (size_t)lang;
  Json::Value::Value((Value *)local_40,objectValue);
  Json::Value::Value(&local_68,(string *)tdi.limit_);
  pVVar3 = Json::Value::operator[]((Value *)local_40,"language");
  Json::Value::operator=(pVVar3,&local_68);
  Json::Value::~Value(&local_68);
  this_00 = (this->super_cmCommonTargetGenerator).Makefile;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&mod_dir.field_2 + 8),"CMAKE_",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)tdi.limit_);
  std::operator+(&local_c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&mod_dir.field_2 + 8),"_COMPILER_ID");
  pcVar4 = cmMakefile::GetSafeDefinition(this_00,&local_c0);
  Json::Value::Value(&local_a0,pcVar4);
  pVVar3 = Json::Value::operator[]((Value *)local_40,"compiler-id");
  Json::Value::operator=(pVVar3,&local_a0);
  Json::Value::~Value(&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)(mod_dir.field_2._M_local_buf + 8));
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          tdi.limit_,"Fortran");
  if (bVar2) {
    pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
    pcVar4 = cmMakefile::GetHomeOutputDirectory((this->super_cmCommonTargetGenerator).Makefile);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_120,pcVar4,&local_121);
    cmGeneratorTarget::GetFortranModuleDirectory((string *)local_100,pcVar1,&local_120);
    std::__cxx11::string::~string((string *)&local_120);
    std::allocator<char>::~allocator((allocator<char> *)&local_121);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) != 0) {
      pcVar4 = cmMakefile::GetCurrentBinaryDirectory((this->super_cmCommonTargetGenerator).Makefile)
      ;
      std::__cxx11::string::operator=((string *)local_100,pcVar4);
    }
    Json::Value::Value(&local_150,(string *)local_100);
    pVVar3 = Json::Value::operator[]((Value *)local_40,"module-dir");
    Json::Value::operator=(pVVar3,&local_150);
    Json::Value::~Value(&local_150);
    std::__cxx11::string::~string((string *)local_100);
  }
  pcVar4 = cmMakefile::GetCurrentBinaryDirectory((this->super_cmCommonTargetGenerator).Makefile);
  Json::Value::Value(&local_178,pcVar4);
  pVVar3 = Json::Value::operator[]((Value *)local_40,"dir-cur-bld");
  Json::Value::operator=(pVVar3,&local_178);
  Json::Value::~Value(&local_178);
  pcVar4 = cmMakefile::GetCurrentSourceDirectory((this->super_cmCommonTargetGenerator).Makefile);
  Json::Value::Value(&local_1a0,pcVar4);
  pVVar3 = Json::Value::operator[]((Value *)local_40,"dir-cur-src");
  Json::Value::operator=(pVVar3,&local_1a0);
  Json::Value::~Value(&local_1a0);
  pcVar4 = cmMakefile::GetHomeOutputDirectory((this->super_cmCommonTargetGenerator).Makefile);
  Json::Value::Value(&local_1c8,pcVar4);
  pVVar3 = Json::Value::operator[]((Value *)local_40,"dir-top-bld");
  Json::Value::operator=(pVVar3,&local_1c8);
  Json::Value::~Value(&local_1c8);
  pcVar4 = cmMakefile::GetHomeDirectory((this->super_cmCommonTargetGenerator).Makefile);
  Json::Value::Value((Value *)&tdi_include_dirs,pcVar4);
  pVVar3 = Json::Value::operator[]((Value *)local_40,"dir-top-src");
  Json::Value::operator=(pVVar3,(Value *)&tdi_include_dirs);
  Json::Value::~Value((Value *)&tdi_include_dirs);
  Json::Value::Value((Value *)&includes.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,arrayValue);
  pVVar3 = Json::Value::operator[]((Value *)local_40,"include-dirs");
  pVVar3 = Json::Value::operator=
                     (pVVar3,(Value *)&includes.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  Json::Value::~Value((Value *)&includes.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&i);
  lang_00 = tdi.limit_;
  pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  this_01 = this->LocalGenerator;
  config = cmCommonTargetGenerator::GetConfigName_abi_cxx11_(&this->super_cmCommonTargetGenerator);
  cmLocalGenerator::GetIncludeDirectories
            ((cmLocalGenerator *)this_01,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&i,pcVar1,(string *)lang_00,config,true);
  local_240._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&i);
  while( true ) {
    local_248._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&i);
    bVar2 = __gnu_cxx::operator!=(&local_240,&local_248);
    if (!bVar2) break;
    pbVar6 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&local_240);
    ConvertToNinjaPath((string *)&tdi_linked_target_dirs,this,pbVar6);
    Json::Value::Value(&local_270,(string *)&tdi_linked_target_dirs);
    Json::Value::append(pVVar3,&local_270);
    Json::Value::~Value(&local_270);
    std::__cxx11::string::~string((string *)&tdi_linked_target_dirs);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_240);
  }
  Json::Value::Value((Value *)&linked.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,arrayValue);
  pVVar3 = Json::Value::operator[]((Value *)local_40,"linked-target-dirs");
  pVVar3 = Json::Value::operator=
                     (pVVar3,(Value *)&linked.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  Json::Value::~Value((Value *)&linked.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cmCommonTargetGenerator::GetLinkedTargetDirectories_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&i_1,&this->super_cmCommonTargetGenerator);
  local_2e0._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&i_1);
  while( true ) {
    local_2e8._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&i_1);
    bVar2 = __gnu_cxx::operator!=(&local_2e0,&local_2e8);
    if (!bVar2) break;
    pbVar6 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&local_2e0);
    Json::Value::Value((Value *)((long)&tdin.field_2 + 8),pbVar6);
    Json::Value::append(pVVar3,(Value *)((long)&tdin.field_2 + 8));
    Json::Value::~Value((Value *)((long)&tdin.field_2 + 8));
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_2e0);
  }
  GetTargetDependInfoPath((string *)&tdif.field_0x240,this,(string *)tdi.limit_);
  pcVar4 = (char *)std::__cxx11::string::c_str();
  cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_578,pcVar4,false,None)
  ;
  Json::operator<<((ostream *)local_578,(Value *)local_40);
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_578);
  std::__cxx11::string::~string((string *)&tdif.field_0x240);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&i_1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&i);
  Json::Value::~Value((Value *)local_40);
  return;
}

Assistant:

void cmNinjaTargetGenerator::WriteTargetDependInfo(std::string const& lang)
{
  Json::Value tdi(Json::objectValue);
  tdi["language"] = lang;
  tdi["compiler-id"] =
    this->Makefile->GetSafeDefinition("CMAKE_" + lang + "_COMPILER_ID");

  if (lang == "Fortran") {
    std::string mod_dir = this->GeneratorTarget->GetFortranModuleDirectory(
      this->Makefile->GetHomeOutputDirectory());
    if (mod_dir.empty()) {
      mod_dir = this->Makefile->GetCurrentBinaryDirectory();
    }
    tdi["module-dir"] = mod_dir;
  }

  tdi["dir-cur-bld"] = this->Makefile->GetCurrentBinaryDirectory();
  tdi["dir-cur-src"] = this->Makefile->GetCurrentSourceDirectory();
  tdi["dir-top-bld"] = this->Makefile->GetHomeOutputDirectory();
  tdi["dir-top-src"] = this->Makefile->GetHomeDirectory();

  Json::Value& tdi_include_dirs = tdi["include-dirs"] = Json::arrayValue;
  std::vector<std::string> includes;
  this->LocalGenerator->GetIncludeDirectories(includes, this->GeneratorTarget,
                                              lang, this->GetConfigName());
  for (std::vector<std::string>::iterator i = includes.begin();
       i != includes.end(); ++i) {
    // Convert the include directories the same way we do for -I flags.
    // See upstream ninja issue 1251.
    tdi_include_dirs.append(this->ConvertToNinjaPath(*i));
  }

  Json::Value& tdi_linked_target_dirs = tdi["linked-target-dirs"] =
    Json::arrayValue;
  std::vector<std::string> linked = this->GetLinkedTargetDirectories();
  for (std::vector<std::string>::iterator i = linked.begin();
       i != linked.end(); ++i) {
    tdi_linked_target_dirs.append(*i);
  }

  std::string const tdin = this->GetTargetDependInfoPath(lang);
  cmGeneratedFileStream tdif(tdin.c_str());
  tdif << tdi;
}